

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkEnum
          (DescriptorBuilder *this,EnumDescriptor *enum_type,EnumDescriptorProto *proto)

{
  EnumOptions *pEVar1;
  EnumDescriptorProto *extraout_RDX;
  EnumDescriptorProto *extraout_RDX_00;
  long lVar2;
  int i;
  long lVar3;
  
  if (*(long *)(enum_type + 0x20) == 0) {
    pEVar1 = EnumOptions::default_instance();
    *(EnumOptions **)(enum_type + 0x20) = pEVar1;
    proto = extraout_RDX;
  }
  lVar2 = 0;
  for (lVar3 = 0; lVar3 < *(int *)(enum_type + 0x2c); lVar3 = lVar3 + 1) {
    CrossLinkEnumValue(this,(EnumValueDescriptor *)(*(long *)(enum_type + 0x30) + lVar2),
                       (EnumValueDescriptorProto *)proto);
    lVar2 = lVar2 + 0x28;
    proto = extraout_RDX_00;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkEnum(EnumDescriptor* enum_type,
                                      const EnumDescriptorProto& proto) {
  if (enum_type->options_ == nullptr) {
    enum_type->options_ = &EnumOptions::default_instance();
  }

  for (int i = 0; i < enum_type->value_count(); i++) {
    CrossLinkEnumValue(&enum_type->values_[i], proto.value(i));
  }
}